

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

bool CoreML::Specification::ArrayFeatureType_ArrayDataType_IsValid(int value)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((value != 0) && (value != 0x10020)) && (value != 0x10040)) && (value != 0x20020)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ArrayFeatureType_ArrayDataType_IsValid(int value) {
  switch (value) {
    case 0:
    case 65568:
    case 65600:
    case 131104:
      return true;
    default:
      return false;
  }
}